

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::QuerySurfaceCase::checkCommonAttributes
          (QuerySurfaceCase *this,EGLDisplay display,EGLSurface surface,ConfigInfo *info)

{
  MessageBuilder *pMVar1;
  MessageBuilder local_1410;
  MessageBuilder local_1290;
  EGLint local_110c;
  undefined1 local_1108 [4];
  EGLint colorspace;
  MessageBuilder local_f88;
  EGLint local_e04;
  undefined1 local_e00 [4];
  EGLint alphaFormat;
  MessageBuilder local_c80;
  EGLint local_afc;
  undefined1 local_af8 [4];
  EGLint swapBehavior;
  MessageBuilder local_978;
  EGLint local_7f4;
  undefined1 local_7f0 [4];
  EGLint multisampleResolve;
  EGLint local_670;
  EGLint local_66c;
  EGLint renderBuffer;
  EGLint local_4e4;
  undefined1 local_4e0 [4];
  EGLint pixelRatio;
  EGLint local_360;
  int local_35c;
  EGLint vRes;
  EGLint hRes;
  EGLint local_1d4;
  int local_1d0;
  EGLint height;
  EGLint width;
  MessageBuilder local_1c0;
  EGLint local_3c;
  TestLog *pTStack_38;
  EGLint id;
  TestLog *log;
  Library *egl;
  ConfigInfo *info_local;
  EGLSurface surface_local;
  EGLDisplay display_local;
  QuerySurfaceCase *this_local;
  
  egl = (Library *)info;
  info_local = (ConfigInfo *)surface;
  surface_local = display;
  display_local = this;
  log = (TestLog *)
        EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  pTStack_38 = tcu::TestContext::getLog
                         ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
  local_3c = eglu::querySurfaceInt((Library *)log,surface_local,info_local,0x3028);
  if (local_3c != *(int *)((long)&egl[5]._vptr_Library + 4)) {
    tcu::TestLog::operator<<(&local_1c0,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [21])"    Fail, config ID ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_3c);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (pMVar1,(char (*) [51])" does not match the one used to create the surface");
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Config ID mismatch");
  }
  local_1d0 = eglu::querySurfaceInt((Library *)log,surface_local,info_local,0x3057);
  local_1d4 = eglu::querySurfaceInt((Library *)log,surface_local,info_local,0x3056);
  if ((local_1d0 < 1) || (local_1d4 < 1)) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)&vRes,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&vRes,(char (*) [32])"    Fail, invalid surface size ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1d0);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a9098a);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1d4);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&vRes);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid surface size");
  }
  local_35c = eglu::querySurfaceInt((Library *)log,surface_local,info_local,0x3090);
  local_360 = eglu::querySurfaceInt((Library *)log,surface_local,info_local,0x3091);
  if ((((local_35c < 1) || (local_360 < 1)) && (local_35c != -1)) && (local_360 != -1)) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_4e0,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_4e0,
                        (char (*) [38])"    Fail, invalid surface resolution ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_35c);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a9098a);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_360);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_4e0);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid surface resolution");
  }
  local_4e4 = eglu::querySurfaceInt((Library *)log,surface_local,info_local,0x3092);
  if ((local_4e4 < 1) && (local_4e4 != -1)) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)&renderBuffer,pTStack_38,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&renderBuffer,
                        (char (*) [38])"    Fail, invalid pixel aspect ratio ");
    local_66c = eglu::querySurfaceInt((Library *)log,surface_local,info_local,0x3092);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_66c);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&renderBuffer);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid pixel aspect ratio");
  }
  local_670 = eglu::querySurfaceInt((Library *)log,surface_local,info_local,0x3086);
  if ((local_670 != 0x3084) && (local_670 != 0x3085)) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_7f0,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_7f0,
                        (char (*) [39])"    Fail, invalid render buffer value ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_670);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_7f0);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid render buffer");
  }
  local_7f4 = eglu::querySurfaceInt((Library *)log,surface_local,info_local,0x3099);
  if ((local_7f4 != 0x309a) && (local_7f4 != 0x309b)) {
    tcu::TestLog::operator<<(&local_978,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (&local_978,(char (*) [45])"    Fail, invalid multisample resolve value ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_7f4);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_978);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid multisample resolve");
  }
  if ((local_7f4 == 0x309b) && (((ulong)egl[0xd]._vptr_Library & 0x200) == 0)) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_af8,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_af8,
                        (char (*) [95])
                        "    Fail, multisample resolve is reported as box filter but configuration does not support it."
                       );
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_af8);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid multisample resolve");
  }
  local_afc = eglu::querySurfaceInt((Library *)log,surface_local,info_local,0x3093);
  if ((local_afc != 0x3095) && (local_afc != 0x3094)) {
    tcu::TestLog::operator<<(&local_c80,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (&local_c80,(char (*) [39])"    Fail, invalid swap behavior value ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_afc);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_c80);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid swap behavior");
  }
  if ((local_afc == 0x3094) && (((ulong)egl[0xd]._vptr_Library & 0x400) == 0)) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_e00,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_e00,
                        (char (*) [87])
                        "    Fail, swap behavior is reported as preserve but configuration does not support it."
                       );
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_e00);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid swap behavior");
  }
  local_e04 = eglu::querySurfaceInt((Library *)log,surface_local,info_local,0x3088);
  if ((local_e04 != 0x308b) && (local_e04 != 0x308c)) {
    tcu::TestLog::operator<<(&local_f88,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (&local_f88,(char (*) [38])"    Fail, invalid alpha format value ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_e04);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_f88);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid alpha format");
  }
  if ((local_e04 == 0x308c) && (((ulong)egl[0xd]._vptr_Library & 0x40) == 0)) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_1108,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1108,
                        (char (*) [83])
                        "    Fail, is set to use premultiplied alpha but configuration does not support it."
                       );
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1108);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid alpha format");
  }
  local_110c = eglu::querySurfaceInt((Library *)log,surface_local,info_local,0x3087);
  if ((local_110c != 0x3089) && (local_110c != 0x308a)) {
    tcu::TestLog::operator<<(&local_1290,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (&local_1290,(char (*) [37])"    Fail, invalid color space value ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_110c);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1290);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid color space");
  }
  if ((local_110c == 0x308a) && (((ulong)egl[0xd]._vptr_Library & 0x20) == 0)) {
    tcu::TestLog::operator<<(&local_1410,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (&local_1410,
                        (char (*) [84])
                        "    Fail, is set to use a linear color space but configuration does not support it."
                       );
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1410);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid color space");
  }
  return;
}

Assistant:

void QuerySurfaceCase::checkCommonAttributes (EGLDisplay display, EGLSurface surface, const ConfigInfo& info)
{
	const Library&	egl		= m_eglTestCtx.getLibrary();
	tcu::TestLog&	log		= m_testCtx.getLog();

	// Attributes which are common to all surface types

	// Config ID
	{
		const EGLint	id	= eglu::querySurfaceInt(egl, display, surface, EGL_CONFIG_ID);

		if (id != info.configId)
		{
			log << TestLog::Message << "    Fail, config ID " << id << " does not match the one used to create the surface" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Config ID mismatch");
		}
	}

	// Width and height
	{
		const EGLint	width	= eglu::querySurfaceInt(egl, display, surface, EGL_WIDTH);
		const EGLint	height	= eglu::querySurfaceInt(egl, display, surface, EGL_HEIGHT);

		if (width <= 0 || height <= 0)
		{
			log << TestLog::Message << "    Fail, invalid surface size " << width << "x" << height << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid surface size");
		}
	}

	// Horizontal and vertical resolution
	{
		const EGLint	hRes	= eglu::querySurfaceInt(egl, display, surface, EGL_HORIZONTAL_RESOLUTION);
		const EGLint	vRes	= eglu::querySurfaceInt(egl, display, surface, EGL_VERTICAL_RESOLUTION);

		if ((hRes <= 0 || vRes <= 0) && (hRes != EGL_UNKNOWN && vRes != EGL_UNKNOWN))
		{
			log << TestLog::Message << "    Fail, invalid surface resolution " << hRes << "x" << vRes << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid surface resolution");
		}
	}

	// Pixel aspect ratio
	{
		const EGLint	pixelRatio	= eglu::querySurfaceInt(egl, display, surface, EGL_PIXEL_ASPECT_RATIO);

		if (pixelRatio <= 0 && pixelRatio != EGL_UNKNOWN)
		{
			log << TestLog::Message << "    Fail, invalid pixel aspect ratio " << eglu::querySurfaceInt(egl, display, surface, EGL_PIXEL_ASPECT_RATIO) << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid pixel aspect ratio");
		}
	}

	// Render buffer
	{
		const EGLint	renderBuffer	= eglu::querySurfaceInt(egl, display, surface, EGL_RENDER_BUFFER);

		if (renderBuffer != EGL_BACK_BUFFER && renderBuffer != EGL_SINGLE_BUFFER)
		{
			log << TestLog::Message << "    Fail, invalid render buffer value " << renderBuffer << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid render buffer");
		}
	}

	// Multisample resolve
	{
		const EGLint	multisampleResolve	= eglu::querySurfaceInt(egl, display, surface, EGL_MULTISAMPLE_RESOLVE);

		if (multisampleResolve != EGL_MULTISAMPLE_RESOLVE_DEFAULT && multisampleResolve != EGL_MULTISAMPLE_RESOLVE_BOX)
		{
			log << TestLog::Message << "    Fail, invalid multisample resolve value " << multisampleResolve << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid multisample resolve");
		}

		if (multisampleResolve == EGL_MULTISAMPLE_RESOLVE_BOX && !(info.surfaceType & EGL_MULTISAMPLE_RESOLVE_BOX_BIT))
		{
			log << TestLog::Message << "    Fail, multisample resolve is reported as box filter but configuration does not support it." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid multisample resolve");
		}
	}

	// Swap behavior
	{
		const EGLint	swapBehavior	= eglu::querySurfaceInt(egl, display, surface, EGL_SWAP_BEHAVIOR);

		if (swapBehavior != EGL_BUFFER_DESTROYED && swapBehavior != EGL_BUFFER_PRESERVED)
		{
			log << TestLog::Message << "    Fail, invalid swap behavior value " << swapBehavior << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid swap behavior");
		}

		if (swapBehavior == EGL_BUFFER_PRESERVED && !(info.surfaceType & EGL_SWAP_BEHAVIOR_PRESERVED_BIT))
		{
			log << TestLog::Message << "    Fail, swap behavior is reported as preserve but configuration does not support it." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid swap behavior");
		}
	}

	// alpha format
	{
		const EGLint	alphaFormat	= eglu::querySurfaceInt(egl, display, surface, EGL_ALPHA_FORMAT);

		if (alphaFormat != EGL_ALPHA_FORMAT_NONPRE && alphaFormat != EGL_ALPHA_FORMAT_PRE)
		{
			log << TestLog::Message << "    Fail, invalid alpha format value " << alphaFormat << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid alpha format");
		}

		if (alphaFormat == EGL_ALPHA_FORMAT_PRE && !(info.surfaceType & EGL_VG_ALPHA_FORMAT_PRE_BIT))
		{
			log << TestLog::Message << "    Fail, is set to use premultiplied alpha but configuration does not support it." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid alpha format");
		}
	}

	// color space
	{
		const EGLint	colorspace	= eglu::querySurfaceInt(egl, display, surface, EGL_COLORSPACE);

		if (colorspace != EGL_VG_COLORSPACE_sRGB && colorspace != EGL_VG_COLORSPACE_LINEAR)
		{
			log << TestLog::Message << "    Fail, invalid color space value " << colorspace << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color space");
		}

		if (colorspace == EGL_VG_COLORSPACE_LINEAR && !(info.surfaceType & EGL_VG_COLORSPACE_LINEAR_BIT))
		{
			log << TestLog::Message << "    Fail, is set to use a linear color space but configuration does not support it." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color space");
		}
	}
}